

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

void __thiscall stackjit::ArrayType::ArrayType(ArrayType *this,Type *elementType)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  Type *local_18;
  Type *elementType_local;
  ArrayType *this_local;
  
  local_18 = elementType;
  elementType_local = (Type *)this;
  Type::name_abi_cxx11_(elementType);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x25e166);
  std::operator+(local_38,(char *)local_58);
  ReferenceType::ReferenceType(&this->super_ReferenceType,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  (this->super_ReferenceType).super_Type._vptr_Type = (_func_int **)&PTR__ArrayType_002a9c68;
  this->mElementType = local_18;
  return;
}

Assistant:

ArrayType::ArrayType(const Type* elementType)
		: ReferenceType("Array[" + elementType->name() + "]"), mElementType(elementType) {

	}